

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove.c
# Opt level: O0

void * memmove(void *__dest,void *__src,size_t __n)

{
  char *local_30;
  char *src;
  char *dest;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  local_30 = (char *)__src;
  src = (char *)__dest;
  dest = (char *)__n;
  if (__src < __dest) {
    local_30 = (char *)(__n + (long)__src);
    src = (char *)(__n + (long)__dest);
    dest = (char *)__n;
    while (dest != (char *)0x0) {
      src[-1] = *(char *)((long)local_30 + -1);
      local_30 = (char *)((long)local_30 + -1);
      src = src + -1;
      dest = dest + -1;
    }
  }
  else {
    while (dest != (char *)0x0) {
      *src = *local_30;
      local_30 = local_30 + 1;
      src = src + 1;
      dest = dest + -1;
    }
  }
  return __dest;
}

Assistant:

void * memmove( void * s1, const void * s2, size_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    if ( dest <= src )
    {
        while ( n-- )
        {
            *dest++ = *src++;
        }
    }
    else
    {
        src += n;
        dest += n;

        while ( n-- )
        {
            *--dest = *--src;
        }
    }

    return s1;
}